

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

VkCommandBuffer __thiscall
VulkanUtilities::VulkanLogicalDevice::AllocateVkCommandBuffer
          (VulkanLogicalDevice *this,VkCommandBufferAllocateInfo *AllocInfo,char *DebugName)

{
  Char *pCVar1;
  char (*in_RCX) [66];
  char *in_R8;
  undefined1 local_81;
  undefined1 local_80 [8];
  string msg_1;
  VkCommandBuffer pVStack_58;
  VkResult err;
  VkCommandBuffer CmdBuff;
  undefined1 local_40 [8];
  string msg;
  char *DebugName_local;
  VkCommandBufferAllocateInfo *AllocInfo_local;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._8_8_ = DebugName;
  if (AllocInfo->sType != VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO) {
    Diligent::FormatString<char[26],char[66]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"AllocInfo.sType == VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO",
               in_RCX);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar1,"AllocateVkCommandBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,399);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (msg.field_2._8_8_ == 0) {
    msg.field_2._8_8_ = (long)" \t" + 2;
  }
  pVStack_58 = (VkCommandBuffer)0x0;
  msg_1.field_2._12_4_ =
       (*vkAllocateCommandBuffers)(this->m_VkDevice,AllocInfo,&stack0xffffffffffffffa8);
  if (msg_1.field_2._12_4_ != VK_SUCCESS) {
    local_81 = 0x27;
    Diligent::FormatString<char[36],char_const*,char>
              ((string *)local_80,(Diligent *)"Failed to allocate command buffer \'",
               (char (*) [36])((long)&msg.field_2 + 8),(char **)&local_81,in_R8);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar1,"AllocateVkCommandBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x197);
    std::__cxx11::string::~string((string *)local_80);
  }
  if (*(char *)msg.field_2._8_8_ != '\0') {
    SetCommandBufferName(this->m_VkDevice,pVStack_58,(char *)msg.field_2._8_8_);
  }
  return pVStack_58;
}

Assistant:

VkCommandBuffer VulkanLogicalDevice::AllocateVkCommandBuffer(const VkCommandBufferAllocateInfo& AllocInfo, const char* DebugName) const
{
    VERIFY_EXPR(AllocInfo.sType == VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO);

    if (DebugName == nullptr)
        DebugName = "";

    VkCommandBuffer CmdBuff = VK_NULL_HANDLE;

    VkResult err = vkAllocateCommandBuffers(m_VkDevice, &AllocInfo, &CmdBuff);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to allocate command buffer '", DebugName, '\'');
    (void)err;

    if (*DebugName != 0)
        SetCommandBufferName(m_VkDevice, CmdBuff, DebugName);

    return CmdBuff;
}